

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O2

void __thiscall perlin::perlin(perlin *this)

{
  double *pdVar1;
  long lVar2;
  vec3 local_50;
  vec3 local_38;
  
  memset(this,0,0x1800);
  for (lVar2 = 0; lVar2 != 0x1800; lVar2 = lVar2 + 0x18) {
    vec3::random();
    unit_vector(&local_50,&local_38);
    *(double *)((long)this->randvec[0].e + lVar2 + 0x10) = local_50.e[2];
    pdVar1 = (double *)((long)this->randvec[0].e + lVar2);
    *pdVar1 = local_50.e[0];
    pdVar1[1] = local_50.e[1];
  }
  perlin_generate_perm(this->perm_x);
  perlin_generate_perm(this->perm_y);
  perlin_generate_perm(this->perm_z);
  return;
}

Assistant:

perlin() {
        for (int i = 0; i < point_count; i++) {
            randvec[i] = unit_vector(vec3::random(-1,1));
        }

        perlin_generate_perm(perm_x);
        perlin_generate_perm(perm_y);
        perlin_generate_perm(perm_z);
    }